

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cc
# Opt level: O3

void gutil::anon_unknown_4::printDescription(ostream *out,string *descr,size_t col,size_t n)

{
  pointer pcVar1;
  char cVar2;
  size_t sVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  char local_53 [3];
  size_t local_50;
  string *local_48;
  size_t local_40;
  ostream *local_38;
  
  uVar6 = descr->_M_string_length;
  local_40 = col;
  if (uVar6 == 0) {
LAB_0015e53c:
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
    std::ostream::put((char)out);
    std::ostream::flush();
    return;
  }
  uVar7 = 0;
  local_50 = n;
  local_48 = descr;
  local_38 = out;
LAB_0015e3d4:
  pcVar1 = (descr->_M_dataplus)._M_p;
  uVar9 = uVar7 + 1;
  uVar8 = uVar7;
  if (uVar7 + 1 < uVar6) {
    uVar9 = uVar6;
  }
  do {
    uVar7 = uVar9;
    iVar4 = isspace((int)pcVar1[uVar8]);
    if (iVar4 == 0) {
      uVar7 = uVar8;
      uVar9 = uVar8;
      if (uVar8 < uVar6) goto LAB_0015e40a;
      break;
    }
    uVar8 = uVar8 + 1;
    uVar9 = uVar7;
  } while (uVar7 != uVar8);
  goto LAB_0015e438;
  while (uVar8 = uVar8 + 1, uVar9 = uVar6, uVar6 != uVar8) {
LAB_0015e40a:
    iVar4 = isspace((int)pcVar1[uVar8]);
    n = local_50;
    uVar9 = uVar8;
    if (iVar4 != 0) break;
  }
LAB_0015e438:
  out = local_38;
  sVar3 = local_40;
  if (local_40 < col && n < (col - uVar7) + uVar9 + 1) {
    cVar2 = (char)local_38;
    std::ios::widen((char)*(undefined8 *)(*(long *)local_38 + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    if (sVar3 == 0) {
      col = 0;
    }
    else {
      sVar5 = sVar3;
      do {
        local_53[0] = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(out,local_53,1);
        sVar5 = sVar5 - 1;
        n = local_50;
        col = sVar3;
      } while (sVar5 != 0);
    }
  }
  uVar6 = ~col + uVar7 + n;
  if ((uVar9 - uVar7) + col + 1 <= n) {
    uVar6 = uVar9;
  }
  if (col == 0) {
    col = 0;
    descr = local_48;
  }
  else {
    col = col + 1;
    local_53[1] = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(out,local_53 + 1,1);
    descr = local_48;
  }
  for (; uVar7 < uVar6; uVar7 = uVar7 + 1) {
    local_53[2] = (descr->_M_dataplus)._M_p[uVar7];
    std::__ostream_insert<char,std::char_traits<char>>(out,local_53 + 2,1);
    col = col + 1;
  }
  uVar6 = descr->_M_string_length;
  if (uVar6 <= uVar7) goto LAB_0015e53c;
  goto LAB_0015e3d4;
}

Assistant:

void printDescription(std::ostream &out, std::string descr, size_t col, size_t n)
{
  size_t i=0;
  size_t c=col;

  while (i < descr.size())
  {
    while (i<descr.size() && isspace(descr[i]))
    {
      i++;
    }

    size_t k=i;

    while (k < descr.size() && !isspace(descr[k]))
    {
      k++;
    }

    if (c+1+k-i > n && c > col)
    {
      out << std::endl;

      for (c=0; c<col; c++)
      {
        out << ' ';
      }
    }

    if (c+1+k-i > n)
    {
      k=i+n-c-1;
    }

    if (c > 0)
    {
      out << ' ';
      c++;
    }

    while (i < k)
    {
      out << descr[i++];
      c++;
    }
  }

  out << std::endl;
}